

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlkem_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_61e64c::MLKEMTest_NistDecap1024TestVectors_Test::TestBody
          (MLKEMTest_NistDecap1024TestVectors_Test *this)

{
  code *local_28 [2];
  code *local_18;
  code *local_10;
  
  local_28[1] = (code *)0x0;
  local_28[0] = 
  MLKEMNistDecapFileTest<MLKEM1024_private_key,_&(anonymous_namespace)::wrapper_1024_parse_private_key,_&MLKEM1024_decap>
  ;
  local_10 = std::_Function_handler<void_(FileTest_*),_void_(*)(FileTest_*)>::_M_invoke;
  local_18 = std::_Function_handler<void_(FileTest_*),_void_(*)(FileTest_*)>::_M_manager;
  FileTestGTest("crypto/mlkem/mlkem1024_nist_decap_tests.txt",
                (function<void_(FileTest_*)> *)local_28);
  std::_Function_base::~_Function_base((_Function_base *)local_28);
  return;
}

Assistant:

TEST(MLKEMTest, NistDecap1024TestVectors) {
  FileTestGTest(
      "crypto/mlkem/mlkem1024_nist_decap_tests.txt",
      MLKEMNistDecapFileTest<MLKEM1024_private_key,
                             wrapper_1024_parse_private_key, MLKEM1024_decap>);
}